

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# as-02-info.cpp
# Opt level: O3

void __thiscall MyAudioDescriptor::FillDescriptor(MyAudioDescriptor *this,MXFReader *Reader)

{
  size_t *psVar1;
  long *plVar2;
  MXFReader *pMVar3;
  MDD_t MVar4;
  byte_t *pbVar5;
  WaveAudioDescriptor *pWVar6;
  long *plVar7;
  undefined8 uVar8;
  _List_node_base *p_Var9;
  _List_node_base *p_Var10;
  ILogSink *pIVar11;
  _Node *__tmp;
  list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
  object_list;
  char buf [64];
  long *local_238;
  undefined1 *local_230;
  undefined8 local_228;
  MXFReader *local_220;
  UL local_218 [2];
  Result_t local_1d0 [104];
  Result_t local_168 [104];
  Result_t local_100 [104];
  Result_t local_98 [104];
  
  MVar4 = ASDCP::DefaultCompositeDict();
  pbVar5 = (byte_t *)ASDCP::Dictionary::Type(MVar4);
  local_218[0].super_Identifier<16U>.m_HasValue = true;
  local_218[0].super_Identifier<16U>.m_Value._0_8_ = *(undefined8 *)pbVar5;
  local_218[0].super_Identifier<16U>.m_Value._8_8_ = *(undefined8 *)(pbVar5 + 8);
  local_218[0].super_Identifier<16U>.super_IArchive._vptr_IArchive =
       (_func_int **)&PTR__IArchive_00113ae8;
  pWVar6 = get_descriptor_by_type<AS_02::PCM::MXFReader,ASDCP::MXF::WaveAudioDescriptor>
                     (Reader,local_218);
  this->m_WaveAudioDescriptor = pWVar6;
  if (pWVar6 == (WaveAudioDescriptor *)0x0) {
    pIVar11 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error(pIVar11,"Audio descriptor not found.\n");
  }
  else {
    (this->super_AudioDescriptor).AudioSamplingRate = *(Rational *)(pWVar6 + 0xf0);
    if (pWVar6[0x100] == (WaveAudioDescriptor)0x1) {
      (this->super_AudioDescriptor).ContainerDuration = *(ui32_t *)(pWVar6 + 0xf8);
    }
  }
  local_228 = 0;
  local_238 = (long *)&local_238;
  local_230 = (undefined1 *)&local_238;
  plVar7 = (long *)(**(code **)(*(long *)Reader + 0x10))(Reader);
  MVar4 = ASDCP::DefaultCompositeDict();
  uVar8 = ASDCP::Dictionary::Type(MVar4);
  (**(code **)(*plVar7 + 0xb0))(local_98,plVar7,uVar8,&local_238);
  Kumu::Result_t::~Result_t(local_98);
  plVar7 = (long *)(**(code **)(*(long *)Reader + 0x10))(Reader);
  MVar4 = ASDCP::DefaultCompositeDict();
  uVar8 = ASDCP::Dictionary::Type(MVar4);
  (**(code **)(*plVar7 + 0xb0))(local_100,plVar7,uVar8,&local_238);
  Kumu::Result_t::~Result_t(local_100);
  plVar7 = (long *)(**(code **)(*(long *)Reader + 0x10))(Reader);
  MVar4 = ASDCP::DefaultCompositeDict();
  uVar8 = ASDCP::Dictionary::Type(MVar4);
  (**(code **)(*plVar7 + 0xb0))(local_168,plVar7,uVar8,&local_238);
  Kumu::Result_t::~Result_t(local_168);
  plVar7 = local_238;
  pMVar3 = Reader;
  if ((long **)local_238 != &local_238) {
    do {
      local_220 = pMVar3;
      if ((plVar7[2] == 0) ||
         (p_Var9 = (_List_node_base *)
                   __dynamic_cast(plVar7[2],&ASDCP::MXF::InterchangeObject::typeinfo,
                                  &ASDCP::MXF::MCALabelSubDescriptor::typeinfo,0),
         p_Var9 == (_List_node_base *)0x0)) {
        pIVar11 = (ILogSink *)Kumu::DefaultLogSink();
        uVar8 = Kumu::bin2UUIDhex((uchar *)(plVar7[2] + 0x61),0x10,(char *)local_218,0x40);
        Kumu::ILogSink::Error(pIVar11,"Audio sub-descriptor type error.\n",uVar8);
      }
      else {
        p_Var10 = (_List_node_base *)operator_new(0x18);
        p_Var10[1]._M_next = p_Var9;
        std::__detail::_List_node_base::_M_hook(p_Var10);
        psVar1 = &(this->m_ChannelDescriptorList).
                  super__List_base<ASDCP::MXF::MCALabelSubDescriptor_*,_std::allocator<ASDCP::MXF::MCALabelSubDescriptor_*>_>
                  ._M_impl._M_node._M_size;
        *psVar1 = *psVar1 + 1;
      }
      plVar7 = (long *)*plVar7;
      Reader = local_220;
      pMVar3 = local_220;
    } while ((long **)plVar7 != &local_238);
  }
  plVar7 = local_238;
  if ((long **)local_238 != &local_238) {
    do {
      plVar2 = (long *)*plVar7;
      operator_delete(plVar7,0x18);
      plVar7 = plVar2;
    } while ((long **)plVar2 != &local_238);
  }
  local_228 = 0;
  local_238 = (long *)&local_238;
  local_230 = (undefined1 *)&local_238;
  plVar7 = (long *)(**(code **)(*(long *)Reader + 0x10))(Reader);
  MVar4 = ASDCP::DefaultCompositeDict();
  uVar8 = ASDCP::Dictionary::Type(MVar4);
  (**(code **)(*plVar7 + 0xb0))(local_1d0,plVar7,uVar8,&local_238);
  Kumu::Result_t::~Result_t(local_1d0);
  if ((long **)local_238 == &local_238) {
    pIVar11 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error(pIVar11,"MXF Metadata contains no Track Sets.\n");
  }
  (this->super_AudioDescriptor).EditRate = *(Rational *)(local_238[2] + 0x108);
  plVar7 = local_238;
  if ((long **)local_238 != &local_238) {
    do {
      plVar2 = (long *)*plVar7;
      operator_delete(plVar7,0x18);
      plVar7 = plVar2;
    } while ((long **)plVar2 != &local_238);
  }
  return;
}

Assistant:

void FillDescriptor(AS_02::PCM::MXFReader& Reader)
  {
    m_WaveAudioDescriptor = get_descriptor_by_type<AS_02::PCM::MXFReader, WaveAudioDescriptor>
      (Reader, DefaultCompositeDict().ul(MDD_WaveAudioDescriptor));

    if ( m_WaveAudioDescriptor != 0 )
      {
	AudioSamplingRate = m_WaveAudioDescriptor->SampleRate;
        if ( ! m_WaveAudioDescriptor->ContainerDuration.empty() )
          {
            ContainerDuration = m_WaveAudioDescriptor->ContainerDuration;
          }
      }
    else
      {
	DefaultLogSink().Error("Audio descriptor not found.\n");
      }

    std::list<InterchangeObject*> object_list;
    Reader.OP1aHeader().GetMDObjectsByType(DefaultCompositeDict().ul(MDD_AudioChannelLabelSubDescriptor), object_list);
    Reader.OP1aHeader().GetMDObjectsByType(DefaultCompositeDict().ul(MDD_SoundfieldGroupLabelSubDescriptor), object_list);
    Reader.OP1aHeader().GetMDObjectsByType(DefaultCompositeDict().ul(MDD_GroupOfSoundfieldGroupsLabelSubDescriptor), object_list);

    std::list<InterchangeObject*>::iterator i = object_list.begin();
    for ( ; i != object_list.end(); ++i )
      {
	MCALabelSubDescriptor *p = dynamic_cast<MCALabelSubDescriptor*>(*i);

	if ( p )
	  {
	    m_ChannelDescriptorList.push_back(p);
	  }
	else
	  {
	    char buf[64];
	    DefaultLogSink().Error("Audio sub-descriptor type error.\n", (**i).InstanceUID.EncodeHex(buf, 64));
	  }
      }

    object_list.clear();
    Reader.OP1aHeader().GetMDObjectsByType(DefaultCompositeDict().ul(MDD_Track), object_list);
    
    if ( object_list.empty() )
      {
	DefaultLogSink().Error("MXF Metadata contains no Track Sets.\n");
      }

    EditRate = ((Track*)object_list.front())->EditRate;
  }